

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

int Js::JavascriptString::LastIndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              charcount_t searchLen,charcount_t position)

{
  char16 cVar1;
  char16 cVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  undefined4 *puVar7;
  char16 *string1;
  uint uVar8;
  uint32 uVar9;
  uint local_34;
  
  if (searchLen == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xda8,"(searchLen > 0)","searchLen > 0");
    if (!bVar4) {
LAB_00d242a5:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    searchLen = 0;
  }
  cVar1 = *searchStr;
  uVar5 = jmpTable[(ushort)cVar1].shift;
  if (jmpTable[(ushort)cVar1].shift == 0) {
    uVar5 = searchLen;
  }
  uVar8 = len - searchLen;
  if (position <= len - searchLen) {
    uVar8 = position;
  }
  string1 = inputStr + uVar8;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    cVar2 = *string1;
    uVar8 = (uint)((ulong)((long)string1 - (long)inputStr) >> 1);
    if (cVar2 == cVar1) {
      iVar6 = PAL_wmemcmp(string1,searchStr,(ulong)searchLen);
      uVar9 = uVar5;
      if (iVar6 != 0) goto LAB_00d2420c;
      iVar6 = 1;
      local_34 = uVar8;
    }
    else {
      if ((0x7f < (ushort)cVar2) ||
         (uVar9 = jmpTable[(ushort)cVar2].shift, jmpTable[(ushort)cVar2].shift == 0)) {
        uVar9 = searchLen;
      }
LAB_00d2420c:
      if (uVar9 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xdcb,"(backwardOffset > 0)","backwardOffset > 0");
        if (!bVar4) goto LAB_00d242a5;
        *puVar7 = 0;
      }
      iVar6 = 5;
      if (uVar9 <= uVar8) {
        string1 = string1 + -(ulong)uVar9;
        iVar6 = 0;
      }
    }
    if (iVar6 != 0) {
      if (iVar6 == 5) {
        local_34 = 0xffffffff;
      }
      return local_34;
    }
  } while( true );
}

Assistant:

int JavascriptString::LastIndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, charcount_t searchLen, charcount_t position)
    {
        Assert(searchLen > 0);
        const char16 searchFirst = searchStr[0];
        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchFirst].shift > 0)
        {
            lMatchedJump = jmpTable[searchFirst].shift;
        }
        WCHAR c;
        char16 const * p = inputStr + min(len - searchLen, position);

        while (true)
        {
            uint32 remaining = (uint32)(p - inputStr);
            uint32 backwardOffset = 0;
            // first character match, keep checking
            if (*p == searchFirst)
            {
                if (wmemcmp(p, searchStr, searchLen) == 0)
                {
                    return (int)remaining;
                }
                backwardOffset = lMatchedJump;
            }
            else
            {
                c = *p;
                if (0 == (c & ~0x7f) && jmpTable[c].shift != 0)
                {
                    backwardOffset = jmpTable[c].shift;
                }
                else
                {
                    backwardOffset = searchLen;
                }
            }
            AssertOrFailFast(backwardOffset > 0);
            if (backwardOffset > remaining)
            {
                break;
            }
            p -= backwardOffset;
        }

        return -1;
    }